

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_set_memory_dev(Integer g_a,char *device)

{
  global_array_t *pgVar1;
  size_t sVar2;
  __int32_t **pp_Var3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  
  sVar2 = strlen(device);
  iVar7 = (int)sVar2;
  if (0x1f < iVar7) {
    pnga_error("Illegal memory device name specified. Device name exceeds length: ",0x1f);
  }
  uVar6 = 0;
  uVar5 = 0;
  if (0 < iVar7) {
    uVar5 = sVar2 & 0xffffffff;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    pp_Var3 = __ctype_tolower_loc();
    device[uVar6] = (char)(*pp_Var3)[device[uVar6]];
  }
  iVar4 = 0;
  for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    if (device[uVar6] != ' ') {
      device[iVar4] = device[uVar6];
      iVar4 = iVar4 + 1;
    }
  }
  if (iVar4 < 0x1f && iVar7 < iVar4) {
    device[iVar4] = '\0';
  }
  pgVar1 = GA + g_a + 1000;
  GA[g_a + 1000].mem_dev_set = 1;
  strcpy(pgVar1->mem_dev,device);
  return;
}

Assistant:

void pnga_set_memory_dev(Integer g_a, char *device) {
  Integer ga_handle = g_a + GA_OFFSET;
  int len = strlen(device);
  int i, ilen;
  if (len>FNAM) {
    pnga_error("Illegal memory device name specified. Device name exceeds length: ",
        FNAM);
  }
  /* convert device name to lower case */
  for (i=0; i<len; i++) {
    device[i] = tolower(device[i]);
  }
  /* remove blanks */
  ilen = 0;
  for (i=0; i<len; i++) {
    if (device[i] != ' ') {
      device [ilen] = device[i];
      ilen++;
    }
  }
  if (ilen > len && ilen < FNAM) device[ilen] = '\0';
  GA[ga_handle].mem_dev_set = 1;
  strcpy(GA[ga_handle].mem_dev,device);
}